

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int read_client_close_proxy(archive_read *a)

{
  uint uVar1;
  uint local_24;
  uint i;
  int r2;
  int r;
  archive_read *a_local;
  
  i = 0;
  if ((a->client).closer == (undefined1 *)0x0) {
    a_local._4_4_ = 0;
  }
  else {
    for (local_24 = 0; local_24 < (a->client).nodes; local_24 = local_24 + 1) {
      uVar1 = (*(code *)(a->client).closer)(a,(a->client).dataset[local_24].data);
      if ((int)uVar1 < (int)i) {
        i = uVar1;
      }
    }
    a_local._4_4_ = i;
  }
  return a_local._4_4_;
}

Assistant:

static int
read_client_close_proxy(struct archive_read *a)
{
	int r = ARCHIVE_OK, r2;
	unsigned int i;

	if (a->client.closer == NULL)
		return (r);
	for (i = 0; i < a->client.nodes; i++)
	{
		r2 = (a->client.closer)
			((struct archive *)a, a->client.dataset[i].data);
		if (r > r2)
			r = r2;
	}
	return (r);
}